

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTable.c
# Opt level: O3

void Map_SuperTableSortSupergates(Map_HashTable_t *p,int nSupersMax)

{
  int iVar1;
  Map_HashEntry_t **ppMVar2;
  long *__base;
  long lVar3;
  Map_HashEntry_t *pMVar4;
  Map_Super_t *pMVar5;
  long *plVar6;
  ulong __nmemb;
  
  __base = (long *)malloc((long)nSupersMax << 3);
  iVar1 = p->nBins;
  __nmemb = 0;
  if (0 < (long)iVar1) {
    ppMVar2 = p->pBins;
    lVar3 = 0;
    do {
      for (pMVar4 = ppMVar2[lVar3]; pMVar4 != (Map_HashEntry_t *)0x0; pMVar4 = pMVar4->pNext) {
        pMVar5 = pMVar4->pGates;
        if (pMVar5 != (Map_Super_t *)0x0) {
          plVar6 = __base + (int)__nmemb;
          do {
            *plVar6 = (long)pMVar5;
            pMVar5 = pMVar5->pNext;
            plVar6 = plVar6 + 1;
            __nmemb = (ulong)((int)__nmemb + 1);
          } while (pMVar5 != (Map_Super_t *)0x0);
        }
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != iVar1);
    __nmemb = (ulong)(int)__nmemb;
  }
  qsort(__base,__nmemb,8,Map_SuperTableCompareSupergates);
  if (*(int *)(*__base + 0xc) < *(int *)(__base[__nmemb - 1] + 0xc)) {
    __assert_fail("Map_SuperTableCompareSupergates( ppSupers, ppSupers + nSupers - 1 ) <= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperTable.c"
                  ,0x14d,"void Map_SuperTableSortSupergates(Map_HashTable_t *, int)");
  }
  lVar3 = 0;
  do {
    if (*(int *)(__base[lVar3] + 0xc) == 0) break;
    printf("%5d : ");
    printf("%5d   ",(ulong)*(uint *)__base[lVar3]);
    printf("A = %5.2f   ",(double)*(float *)(__base[lVar3] + 0xec));
    printf("D = %5.2f   ",(double)*(float *)(__base[lVar3] + 0xe0));
    printf("%s",*(undefined8 *)(__base[lVar3] + 0xf0));
    putchar(10);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 10);
  free(__base);
  return;
}

Assistant:

void Map_SuperTableSortSupergates( Map_HashTable_t * p, int nSupersMax )
{
    Map_HashEntry_t * pEnt;
    Map_Super_t ** ppSupers;
    Map_Super_t * pSuper;
    int nSupers, i;

    // copy all the supergates into one array
    ppSupers = ABC_ALLOC( Map_Super_t *, nSupersMax );
    nSupers = 0;
    for ( i = 0; i < p->nBins; i++ )
        for ( pEnt = p->pBins[i]; pEnt; pEnt = pEnt->pNext )
            for ( pSuper = pEnt->pGates; pSuper; pSuper = pSuper->pNext )
                ppSupers[nSupers++] = pSuper;

    // sort by usage
    qsort( (void *)ppSupers, (size_t)nSupers, sizeof(Map_Super_t *), 
            (int (*)(const void *, const void *)) Map_SuperTableCompareSupergates );
    assert( Map_SuperTableCompareSupergates( ppSupers, ppSupers + nSupers - 1 ) <= 0 );

    // print out the "top ten"
//    for ( i = 0; i < nSupers; i++ )
    for ( i = 0; i < 10; i++ )
    {
        if ( ppSupers[i]->nUsed == 0 )
            break;
        printf( "%5d : ",        ppSupers[i]->nUsed );
        printf( "%5d   ",        ppSupers[i]->Num );
        printf( "A = %5.2f   ",  ppSupers[i]->Area );
        printf( "D = %5.2f   ",  ppSupers[i]->tDelayMax.Rise );
        printf( "%s",            ppSupers[i]->pFormula );
        printf( "\n" );
    }
    ABC_FREE( ppSupers );
}